

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O1

void __thiscall
pico_tree::internal::
splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>>
::operator()(splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>>
             *this,value_type param_1,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *split,
            size_type *split_dim,scalar_type *split_val)

{
  long lVar1;
  size_type i;
  size_type sVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:271:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:261:11)>
  __comp_00;
  
  fVar5 = -3.4028235e+38;
  sVar2 = 0;
  do {
    fVar6 = (box->storage_).coords_max._M_elems[sVar2] - (box->storage_).coords_min._M_elems[sVar2];
    if (fVar5 < fVar6) {
      *split_dim = sVar2;
      fVar5 = fVar6;
    }
    sVar2 = sVar2 + 1;
  } while (sVar2 != 0x310);
  *split_val = fVar5 * 0.5 + (box->storage_).coords_min._M_elems[*split_dim];
  _Var3 = ::std::operator()(begin._M_current,end._M_current);
  split->_M_current = (int *)_Var3;
  if (_Var3._M_current == end._M_current) {
    _Var3._M_current = _Var3._M_current + -1;
    split->_M_current = (int *)_Var3;
    if (_Var3._M_current != end._M_current && begin._M_current != end._M_current) {
      uVar4 = (long)end._M_current - (long)begin._M_current >> 2;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      __comp_00._M_comp.split_dim = split_dim;
      __comp_00._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            *)this;
      ::std::operator()(begin,_Var3,end,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
    }
  }
  else {
    if (_Var3._M_current != begin._M_current) {
      return;
    }
    _Var3._M_current = _Var3._M_current + 1;
    split->_M_current = (int *)_Var3;
    if (_Var3._M_current != end._M_current && begin._M_current != end._M_current) {
      uVar4 = (long)end._M_current - (long)begin._M_current >> 2;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      __comp._M_comp.split_dim = split_dim;
      __comp._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            *)this;
      ::std::operator()(begin,_Var3,end,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,__comp);
    }
  }
  *split_val = *(scalar_type *)((long)*split->_M_current * 0xc40 + **(long **)this + *split_dim * 4)
  ;
  return;
}

Assistant:

inline void operator()(
      typename std::iterator_traits<
          RandomAccessIterator_>::value_type const,  // depth
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type const& box,
      RandomAccessIterator_& split,
      size_type& split_dim,
      scalar_type& split_val) const {
    scalar_type max_delta;
    box.max_side(split_dim, max_delta);
    split_val = max_delta / scalar_type(2.0) + box.min(split_dim);

    // Everything smaller than split_val goes left, the rest right.
    auto const comp = [this, &split_dim, &split_val](auto const index) -> bool {
      return space_[index][split_dim] < split_val;
    };

    split = std::partition(begin, end, comp);

    // If it happens that either all points are on the left side or right
    // side, one point slides to the other side and we split on the first
    // right value instead of the middle split. In these two cases the split
    // value is unknown and a partial sort is required to obtain it, but also
    // to rearrange all other indices such that they are on their
    // corresponding left or right side.
    if (split == end) {
      split--;
      std::nth_element(
          begin,
          split,
          end,
          [this, &split_dim](auto const index_a, auto const index_b) -> bool {
            return space_[index_a][split_dim] < space_[index_b][split_dim];
          });
      split_val = space_[*split][split_dim];
    } else if (split == begin) {
      split++;
      std::nth_element(
          begin,
          split,
          end,
          [this, &split_dim](auto const index_a, auto const index_b) -> bool {
            return space_[index_a][split_dim] < space_[index_b][split_dim];
          });
      split_val = space_[*split][split_dim];
    }
  }